

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_validator_factory_6.hpp
# Opt level: O0

schema_validator_ptr_type __thiscall
jsoncons::jsonschema::draft6::
schema_validator_factory_6<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
::make_schema_validator
          (schema_validator_factory_6<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
           *this,compilation_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                 *context,
          basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *sch,
          span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_18446744073709551615UL>
          keys,anchor_uri_map_type *anchor_dict)

{
  string_view str;
  json_type jVar1;
  bool bVar2;
  __normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>
  _Var3;
  pointer this_00;
  key_type *pkVar4;
  value_type *pvVar5;
  reference this_01;
  compilation_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *pcVar6;
  size_t in_RCX;
  compilation_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *in_RDX;
  long *in_RSI;
  __uniq_ptr_data<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>,_true,_true>
  in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  const_object_iterator cVar7;
  iterator iVar8;
  random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>
  *in_stack_00000008;
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *item;
  iterator __end0_3;
  iterator __begin0_3;
  const_object_range_type *__range6;
  uri_wrapper *uri_1;
  const_iterator __end0_2;
  const_iterator __begin0_2;
  vector<jsoncons::jsonschema::uri_wrapper,_std::allocator<jsoncons::jsonschema::uri_wrapper>_>
  *__range5_1;
  schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *p_1;
  uri id;
  uri relative;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> default_value;
  string sub_keys [2];
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *def;
  iterator __end0_1;
  iterator __begin0_1;
  const_object_range_type *__range7;
  const_object_iterator it2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>_>_>
  defs;
  vector<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>,_std::allocator<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>_>
  validators;
  const_object_iterator it;
  uri_wrapper *uri;
  const_iterator __end0;
  const_iterator __begin0;
  vector<jsoncons::jsonschema::uri_wrapper,_std::allocator<jsoncons::jsonschema::uri_wrapper>_>
  *__range5;
  schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *p;
  compilation_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  new_context;
  schema_validator_ptr_type *schema_validator_ptr;
  random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>
  *in_stack_fffffffffffff598;
  compilation_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *in_stack_fffffffffffff5a0;
  compilation_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *in_stack_fffffffffffff5a8;
  reference in_stack_fffffffffffff5b0;
  uri_wrapper *in_stack_fffffffffffff5b8;
  schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *in_stack_fffffffffffff5c0;
  vector<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>,_std::allocator<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>_>
  *in_stack_fffffffffffff5c8;
  allocator<char> *in_stack_fffffffffffff5d0;
  char *in_stack_fffffffffffff5d8;
  uri *__args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff5e0;
  char *in_stack_fffffffffffff5e8;
  string_view_type *in_stack_fffffffffffff618;
  element_type *peVar9;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
  *in_stack_fffffffffffff620;
  element_type *this_02;
  string *in_stack_fffffffffffff650;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
  *in_stack_fffffffffffff658;
  compilation_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *in_stack_fffffffffffff660;
  schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *in_stack_fffffffffffff668;
  size_t sVar10;
  char *pcVar11;
  uri *in_stack_fffffffffffff6c8;
  uri_wrapper *in_stack_fffffffffffff6d0;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_868;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_860;
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *local_858;
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *local_850;
  undefined1 local_848;
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *local_840;
  undefined1 local_838;
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *local_830;
  undefined1 local_828;
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *local_820;
  undefined1 local_818;
  range<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>,_jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>_>
  local_810;
  range<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>,_jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>_>
  *local_7f0;
  reference local_7e8;
  uri_wrapper *local_7e0;
  __normal_iterator<const_jsoncons::jsonschema::uri_wrapper_*,_std::vector<jsoncons::jsonschema::uri_wrapper,_std::allocator<jsoncons::jsonschema::uri_wrapper>_>_>
  local_7d8;
  vector<jsoncons::jsonschema::uri_wrapper,_std::allocator<jsoncons::jsonschema::uri_wrapper>_>
  *local_7d0;
  pointer local_7c8;
  uri_wrapper *in_stack_fffffffffffff8d8;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
  *in_stack_fffffffffffff8e0;
  schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *in_stack_fffffffffffff8e8;
  uri local_660 [2];
  string local_538 [32];
  undefined1 local_518 [16];
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
  *in_stack_fffffffffffffb18;
  string *in_stack_fffffffffffffb20;
  uri_wrapper *in_stack_fffffffffffffb28;
  schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *in_stack_fffffffffffffb30;
  uri *in_stack_fffffffffffffb70;
  uri *in_stack_fffffffffffffb78;
  undefined8 local_450;
  undefined8 local_448;
  undefined1 local_440 [14];
  undefined1 local_432;
  allocator<char> local_431;
  element_type *local_430;
  element_type local_428;
  string local_408 [32];
  reference local_3e8;
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *local_3e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_3d8;
  undefined1 local_3c8;
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *local_3c0;
  undefined1 local_3b8;
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *local_3b0;
  undefined1 local_3a8;
  range<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>,_jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>_>
  local_3a0;
  range<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>,_jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>_>
  *local_380;
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *local_378;
  undefined1 local_370;
  range<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>,_jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>_>
  local_368;
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *local_348;
  undefined1 local_340;
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *local_338;
  undefined1 local_330;
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *local_318;
  undefined1 local_310;
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *local_2c0;
  undefined1 local_2b8;
  range<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>,_jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>_>
  local_2b0;
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *local_290;
  undefined1 local_288;
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *local_280;
  undefined1 local_278;
  char local_270 [16];
  undefined1 uVar12;
  undefined7 in_stack_fffffffffffffda9;
  compilation_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *in_stack_fffffffffffffdb0;
  schema_validator_factory_6<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *in_stack_fffffffffffffdb8;
  __normal_iterator<const_jsoncons::jsonschema::uri_wrapper_*,_std::vector<jsoncons::jsonschema::uri_wrapper,_std::allocator<jsoncons::jsonschema::uri_wrapper>_>_>
  local_240;
  vector<jsoncons::jsonschema::uri_wrapper,_std::allocator<jsoncons::jsonschema::uri_wrapper>_>
  *local_238;
  pointer local_230;
  undefined1 local_209;
  undefined4 local_208;
  undefined4 uStack_204;
  undefined4 uStack_200;
  undefined4 uStack_1fc;
  compilation_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  local_1f0;
  size_t local_30;
  compilation_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *local_28;
  undefined4 local_18;
  undefined4 uStack_14;
  undefined4 uStack_10;
  undefined4 uStack_c;
  
  local_18 = (undefined4)in_R8;
  uStack_14 = (undefined4)((ulong)in_R8 >> 0x20);
  uStack_10 = (undefined4)in_R9;
  uStack_c = (undefined4)((ulong)in_R9 >> 0x20);
  local_208 = local_18;
  uStack_204 = uStack_14;
  uStack_200 = uStack_10;
  uStack_1fc = uStack_c;
  local_30 = in_RCX;
  local_28 = in_RDX;
  (**(code **)(*in_RSI + 0x10))(&local_1f0,in_RSI,in_RDX,in_RCX,in_R8,in_R9);
  local_209 = 0;
  std::
  unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>
  ::
  unique_ptr<std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>,void>
            ((unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
              *)in_stack_fffffffffffff5a0);
  jVar1 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::type
                    ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                     in_stack_fffffffffffff5a8);
  if (jVar1 == bool_value) {
    schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    ::make_boolean_schema
              (in_stack_fffffffffffff668,in_stack_fffffffffffff660,in_stack_fffffffffffff658);
    std::
    unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
    ::operator=((unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                 *)in_stack_fffffffffffff5a0,
                (unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                 *)in_stack_fffffffffffff598);
    std::
    unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
    ::~unique_ptr((unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                   *)in_stack_fffffffffffff5b0);
    local_230 = std::
                unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                ::get((unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                       *)in_stack_fffffffffffff5a0);
    local_238 = compilation_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                ::uris(&local_1f0);
    local_240._M_current =
         (uri_wrapper *)
         std::
         vector<jsoncons::jsonschema::uri_wrapper,_std::allocator<jsoncons::jsonschema::uri_wrapper>_>
         ::begin((vector<jsoncons::jsonschema::uri_wrapper,_std::allocator<jsoncons::jsonschema::uri_wrapper>_>
                  *)in_stack_fffffffffffff598);
    std::
    vector<jsoncons::jsonschema::uri_wrapper,_std::allocator<jsoncons::jsonschema::uri_wrapper>_>::
    end((vector<jsoncons::jsonschema::uri_wrapper,_std::allocator<jsoncons::jsonschema::uri_wrapper>_>
         *)in_stack_fffffffffffff598);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_jsoncons::jsonschema::uri_wrapper_*,_std::vector<jsoncons::jsonschema::uri_wrapper,_std::allocator<jsoncons::jsonschema::uri_wrapper>_>_>
                          *)in_stack_fffffffffffff5a0,
                         (__normal_iterator<const_jsoncons::jsonschema::uri_wrapper_*,_std::vector<jsoncons::jsonschema::uri_wrapper,_std::allocator<jsoncons::jsonschema::uri_wrapper>_>_>
                          *)in_stack_fffffffffffff598);
      if (!bVar2) break;
      __gnu_cxx::
      __normal_iterator<const_jsoncons::jsonschema::uri_wrapper_*,_std::vector<jsoncons::jsonschema::uri_wrapper,_std::allocator<jsoncons::jsonschema::uri_wrapper>_>_>
      ::operator*(&local_240);
      schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
      ::insert_schema(in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8,
                      (schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                       *)in_stack_fffffffffffff5b0);
      __gnu_cxx::
      __normal_iterator<const_jsoncons::jsonschema::uri_wrapper_*,_std::vector<jsoncons::jsonschema::uri_wrapper,_std::allocator<jsoncons::jsonschema::uri_wrapper>_>_>
      ::operator++(&local_240);
    }
  }
  else {
    if (jVar1 != object_value) {
      pcVar6 = (compilation_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                *)__cxa_allocate_exception(0x18);
      compilation_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
      ::get_base_uri(pcVar6);
      jsoncons::uri::string_abi_cxx11_((uri *)&stack0xfffffffffffff6c8);
      std::operator+(in_stack_fffffffffffff5e8,in_stack_fffffffffffff5e0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar6,
                     (char *)in_stack_fffffffffffff5a0);
      schema_error::schema_error((schema_error *)in_stack_fffffffffffff5b0,(string *)pcVar6);
      __cxa_throw(pcVar6,&schema_error::typeinfo,schema_error::~schema_error);
    }
    pcVar11 = local_270;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff5b0,
               (char *)in_stack_fffffffffffff5a8);
    cVar7 = basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::find_abi_cxx11_
                      (in_stack_fffffffffffff620,in_stack_fffffffffffff618);
    local_280 = (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                 *)cVar7.it_._M_current;
    local_278 = cVar7.has_value_;
    _Var3._M_current = local_280;
    uVar12 = local_278;
    basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::object_range_abi_cxx11_
              ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
               in_stack_fffffffffffff650);
    iVar8 = range<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>,_jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>_>
            ::end(&local_2b0);
    local_2c0 = (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                 *)iVar8.it_._M_current;
    local_2b8 = iVar8.has_value_;
    local_290 = local_2c0;
    local_288 = local_2b8;
    bVar2 = detail::
            random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>
            ::operator!=((random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>
                          *)in_stack_fffffffffffff5a0,in_stack_fffffffffffff598);
    if (bVar2) {
      std::
      vector<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>,_std::allocator<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>_>
      ::vector((vector<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>,_std::allocator<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>_>
                *)0x7d6ee4);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>_>_>
      ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>_>_>
             *)0x7d6ef1);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff5b0,
                 (char *)in_stack_fffffffffffff5a8);
      cVar7 = basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
              find_abi_cxx11_(in_stack_fffffffffffff620,in_stack_fffffffffffff618);
      _Var3 = cVar7.it_._M_current;
      local_330 = cVar7.has_value_;
      local_338 = _Var3._M_current;
      local_318 = _Var3._M_current;
      local_310 = local_330;
      basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
      object_range_abi_cxx11_
                ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                 in_stack_fffffffffffff650);
      iVar8 = range<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>,_jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>_>
              ::end(&local_368);
      local_378 = (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                   *)iVar8.it_._M_current;
      local_370 = iVar8.has_value_;
      local_348 = local_378;
      local_340 = local_370;
      bVar2 = detail::
              random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>
              ::operator!=((random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>
                            *)in_stack_fffffffffffff5a0,in_stack_fffffffffffff598);
      sVar10 = local_30;
      if (bVar2) {
        this_00 = detail::
                  random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>
                  ::operator->((random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>
                                *)0x7d6ffb);
        key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
        ::value(this_00);
        basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
        object_range_abi_cxx11_
                  ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                   in_stack_fffffffffffff650);
        local_380 = &local_3a0;
        iVar8 = range<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>,_jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>_>
                ::begin(local_380);
        local_3c0 = (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                     *)iVar8.it_._M_current;
        local_3b8 = iVar8.has_value_;
        local_3b0 = local_3c0;
        local_3a8 = local_3b8;
        iVar8 = range<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>,_jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>_>
                ::end(local_380);
        local_3e0 = (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                     *)iVar8.it_._M_current;
        local_3d8._M_local_buf[0] = iVar8.has_value_;
        sVar10 = local_30;
        local_3d8._8_8_ = local_3e0;
        local_3c8 = local_3d8._M_local_buf[0];
        while (bVar2 = detail::
                       random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>
                       ::operator!=((random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>
                                     *)in_stack_fffffffffffff5a0,in_stack_fffffffffffff598), bVar2)
        {
          local_3e8 = detail::
                      random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>
                      ::operator*((random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>
                                   *)0x7d70c4);
          local_432 = 1;
          local_430 = &local_428;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffff5e0,in_stack_fffffffffffff5d8,in_stack_fffffffffffff5d0);
          in_stack_fffffffffffff650 = local_408;
          local_430 = (element_type *)in_stack_fffffffffffff650;
          pkVar4 = key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                   ::key(local_3e8);
          std::__cxx11::string::string(in_stack_fffffffffffff650,(string *)pkVar4);
          local_432 = 0;
          std::allocator<char>::~allocator(&local_431);
          key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
          ::key(local_3e8);
          pcVar6 = local_28;
          pvVar5 = key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                   ::value(local_3e8);
          detail::span<std::__cxx11::string_const,18446744073709551615ul>::span<2ul>
                    ((span<std::__cxx11::string_const,18446744073709551615ul> *)&local_450,
                     (element_type (*) [2])&local_428);
          in_stack_fffffffffffff598 = in_stack_00000008;
          (**(code **)(*in_RSI + 0x18))(local_440,in_RSI,pcVar6,pvVar5,local_450,local_448);
          std::
          map<std::__cxx11::string,std::unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>>>>
          ::
          emplace<std::__cxx11::string_const&,std::unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>>
                    ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>_>_>
                      *)in_stack_fffffffffffff5b0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff5a8,
                     (unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                      *)in_stack_fffffffffffff5a0);
          std::
          unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
          ::~unique_ptr((unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                         *)in_stack_fffffffffffff5b0);
          peVar9 = &local_428;
          this_02 = (element_type *)&local_3e8;
          do {
            this_02 = this_02 + -1;
            std::__cxx11::string::~string((string *)this_02);
          } while (this_02 != peVar9);
          detail::
          random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>
          ::operator++((random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>
                        *)in_stack_fffffffffffff5a0);
        }
      }
      basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
      basic_json<jsoncons::null_type,void>
                ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                 in_stack_fffffffffffff5c0,(null_type *)in_stack_fffffffffffff5b8);
      this_01 = detail::
                random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>
                ::operator*((random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>
                             *)0x7d73ec);
      key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
      ::value(this_01);
      basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
      as<std::__cxx11::string>
                ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                 in_stack_fffffffffffff5a8);
      local_518 = std::__cxx11::string::operator_cast_to_basic_string_view(local_538);
      str._M_str = pcVar11;
      str._M_len = sVar10;
      jsoncons::uri::uri((uri *)_Var3._M_current,str);
      std::__cxx11::string::~string(local_538);
      compilation_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
      ::get_base_uri(in_stack_fffffffffffff5a8);
      jsoncons::uri::resolve(in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
      jsoncons::uri::~uri((uri *)0x7d7492);
      uri_wrapper::uri_wrapper(in_stack_fffffffffffff6d0,in_stack_fffffffffffff6c8);
      schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
      ::get_or_create_reference
                (in_stack_fffffffffffff8e8,in_stack_fffffffffffff8e0,in_stack_fffffffffffff8d8);
      __args = local_660;
      std::
      unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>
      ::
      unique_ptr<jsoncons::jsonschema::ref_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::ref_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>,void>
                ((unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                  *)in_stack_fffffffffffff5b0,
                 (unique_ptr<jsoncons::jsonschema::ref_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::ref_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                  *)in_stack_fffffffffffff5a8);
      std::
      vector<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>,_std::allocator<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>_>
      ::push_back((vector<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>,_std::allocator<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>_>
                   *)in_stack_fffffffffffff5a0,(value_type *)in_stack_fffffffffffff598);
      std::
      unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
      ::~unique_ptr((unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                     *)in_stack_fffffffffffff5b0);
      std::
      unique_ptr<jsoncons::jsonschema::ref_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::ref_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
      ::~unique_ptr((unique_ptr<jsoncons::jsonschema::ref_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::ref_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                     *)in_stack_fffffffffffff5a0);
      uri_wrapper::~uri_wrapper(&in_stack_fffffffffffff5a0->base_uri_);
      compilation_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
      ::get_base_uri(in_stack_fffffffffffff5a8);
      compilation_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
      ::id(local_28);
      std::
      make_unique<jsoncons::jsonschema::object_schema_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,jsoncons::uri,std::optional<jsoncons::uri>const&,std::vector<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>,std::allocator<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>>>,std::map<std::__cxx11::string,std::unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>>>>,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                (__args,(optional<jsoncons::uri> *)in_stack_fffffffffffff5d0,
                 in_stack_fffffffffffff5c8,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>_>_>
                  *)in_stack_fffffffffffff5c0,
                 (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                 in_stack_fffffffffffff5b8);
      std::
      unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>
      ::operator=((unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                   *)in_stack_fffffffffffff5b0,
                  (unique_ptr<jsoncons::jsonschema::object_schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::object_schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                   *)in_stack_fffffffffffff5a8);
      std::
      unique_ptr<jsoncons::jsonschema::object_schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::object_schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
      ::~unique_ptr((unique_ptr<jsoncons::jsonschema::object_schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::object_schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                     *)in_stack_fffffffffffff5a0);
      jsoncons::uri::~uri((uri *)0x7d75b4);
      jsoncons::uri::~uri((uri *)0x7d75c1);
      jsoncons::uri::~uri((uri *)0x7d75ce);
      basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::~basic_json
                ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                 0x7d75db);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>_>_>
              *)0x7d75e8);
      std::
      vector<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>,_std::allocator<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>_>
      ::~vector((vector<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>,_std::allocator<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>_>
                 *)in_stack_fffffffffffff5b0);
    }
    else {
      make_object_schema_validator
                (in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0,
                 (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                 CONCAT71(in_stack_fffffffffffffda9,uVar12),(anchor_uri_map_type *)_Var3._M_current)
      ;
      std::
      unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
      ::operator=((unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                   *)in_stack_fffffffffffff5a0,
                  (unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                   *)in_stack_fffffffffffff598);
      std::
      unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
      ::~unique_ptr((unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                     *)in_stack_fffffffffffff5b0);
    }
    local_7c8 = std::
                unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                ::get((unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                       *)in_stack_fffffffffffff5a0);
    local_7d0 = compilation_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                ::uris(&local_1f0);
    local_7d8._M_current =
         (uri_wrapper *)
         std::
         vector<jsoncons::jsonschema::uri_wrapper,_std::allocator<jsoncons::jsonschema::uri_wrapper>_>
         ::begin((vector<jsoncons::jsonschema::uri_wrapper,_std::allocator<jsoncons::jsonschema::uri_wrapper>_>
                  *)in_stack_fffffffffffff598);
    local_7e0 = (uri_wrapper *)
                std::
                vector<jsoncons::jsonschema::uri_wrapper,_std::allocator<jsoncons::jsonschema::uri_wrapper>_>
                ::end((vector<jsoncons::jsonschema::uri_wrapper,_std::allocator<jsoncons::jsonschema::uri_wrapper>_>
                       *)in_stack_fffffffffffff598);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_jsoncons::jsonschema::uri_wrapper_*,_std::vector<jsoncons::jsonschema::uri_wrapper,_std::allocator<jsoncons::jsonschema::uri_wrapper>_>_>
                          *)in_stack_fffffffffffff5a0,
                         (__normal_iterator<const_jsoncons::jsonschema::uri_wrapper_*,_std::vector<jsoncons::jsonschema::uri_wrapper,_std::allocator<jsoncons::jsonschema::uri_wrapper>_>_>
                          *)in_stack_fffffffffffff598);
      if (!bVar2) break;
      local_7e8 = __gnu_cxx::
                  __normal_iterator<const_jsoncons::jsonschema::uri_wrapper_*,_std::vector<jsoncons::jsonschema::uri_wrapper,_std::allocator<jsoncons::jsonschema::uri_wrapper>_>_>
                  ::operator*(&local_7d8);
      schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
      ::insert_schema(in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8,
                      (schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                       *)in_stack_fffffffffffff5b0);
      basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
      object_range_abi_cxx11_
                ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                 in_stack_fffffffffffff650);
      local_7f0 = &local_810;
      iVar8 = range<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>,_jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>_>
              ::begin(local_7f0);
      local_830 = (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                   *)iVar8.it_._M_current;
      local_828 = iVar8.has_value_;
      local_820 = local_830;
      local_818 = local_828;
      iVar8 = range<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>,_jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>_>
              ::end(local_7f0);
      local_850 = (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                   *)iVar8.it_._M_current;
      local_848 = iVar8.has_value_;
      local_840 = local_850;
      local_838 = local_848;
      while( true ) {
        bVar2 = detail::
                random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>
                ::operator!=((random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>
                              *)in_stack_fffffffffffff5a0,in_stack_fffffffffffff598);
        if (!bVar2) break;
        local_858 = detail::
                    random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>
                    ::operator*((random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>
                                 *)0x7d7905);
        schema_validator_factory_6<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
        ::known_keywords_abi_cxx11_();
        key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
        ::key(local_858);
        local_860._M_cur =
             (__node_type *)
             std::
             unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::find((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffff598,(key_type *)0x7d7933);
        in_stack_fffffffffffff5c0 =
             (schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
              *)schema_validator_factory_6<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                ::known_keywords_abi_cxx11_();
        local_868._M_cur =
             (__node_type *)
             std::
             unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffff598);
        bVar2 = std::__detail::operator==(&local_860,&local_868);
        if (bVar2) {
          in_stack_fffffffffffff5b0 = local_7e8;
          in_stack_fffffffffffff5b8 =
               (uri_wrapper *)
               key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
               ::key(local_858);
          key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
          ::value(local_858);
          schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
          ::insert_unknown_keyword
                    (in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,in_stack_fffffffffffffb20,
                     in_stack_fffffffffffffb18);
        }
        detail::
        random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>
        ::operator++((random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>
                      *)in_stack_fffffffffffff5a0);
      }
      __gnu_cxx::
      __normal_iterator<const_jsoncons::jsonschema::uri_wrapper_*,_std::vector<jsoncons::jsonschema::uri_wrapper,_std::allocator<jsoncons::jsonschema::uri_wrapper>_>_>
      ::operator++(&local_7d8);
    }
  }
  local_209 = 1;
  compilation_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  ::~compilation_context(in_stack_fffffffffffff5a0);
  return (__uniq_ptr_data<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>,_true,_true>
          )(tuple<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
            )in_RDI.
             super___uniq_ptr_impl<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
             .
             super__Head_base<0UL,_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_false>
             ._M_head_impl;
}

Assistant:

schema_validator_ptr_type make_schema_validator( 
            const compilation_context<Json>& context, const Json& sch, jsoncons::span<const std::string> keys, 
            anchor_uri_map_type& anchor_dict) override
        {
            auto new_context = make_compilation_context(context, sch, keys);
            //std::cout << "make_schema_validator " << context.get_base_uri().string() << ", " << new_context.get_base_uri().string() << "\n\n";

            schema_validator_ptr_type schema_validator_ptr;

            switch (sch.type())
            {
                case json_type::bool_value:
                {
                    schema_validator_ptr = this->make_boolean_schema(new_context, sch);
                    schema_validator<Json>* p = schema_validator_ptr.get();
                    for (const auto& uri : new_context.uris()) 
                    { 
                        this->insert_schema(uri, p);
                    }          
                    break;
                }
                case json_type::object_value:
                {
                    auto it = sch.find("$ref");
                    if (it != sch.object_range().end()) // this schema is a reference
                    {
                        std::vector<keyword_validator_ptr_type> validators;
                        std::map<std::string,schema_validator_ptr_type> defs;

                        auto it2 = sch.find("definitions");
                        if (it2 != sch.object_range().end()) 
                        {
                            for (const auto& def : it2->value().object_range())
                            {
                                std::string sub_keys[] = { "definitions", def.key() };
                                defs.emplace(def.key(), make_schema_validator(context, def.value(), sub_keys, anchor_dict));
                            }
                        }

                        Json default_value{ jsoncons::null_type() };
                        uri relative((*it).value().template as<std::string>()); 
                        auto id = context.get_base_uri().resolve(relative)                   ;
                        validators.push_back(this->get_or_create_reference(sch, uri_wrapper{id}));
                        schema_validator_ptr = jsoncons::make_unique<object_schema_validator<Json>>(
                            new_context.get_base_uri(), context.id(),
                            std::move(validators), std::move(defs), std::move(default_value));
                    }
                    else
                    {
                        schema_validator_ptr = make_object_schema_validator(new_context, sch, anchor_dict);
                    }
                    schema_validator<Json>* p = schema_validator_ptr.get();
                    for (const auto& uri : new_context.uris()) 
                    { 
                        this->insert_schema(uri, p);
                        for (const auto& item : sch.object_range())
                        {
                            if (known_keywords().find(item.key()) == known_keywords().end())
                            {
                                this->insert_unknown_keyword(uri, item.key(), item.value()); // save unknown keywords for later reference
                            }
                        }
                    }          
                    break;
                }
                default:
                    JSONCONS_THROW(schema_error("invalid JSON-type for a schema for " + new_context.get_base_uri().string() + ", expected: boolean or object"));
                    break;
            }
            
            return schema_validator_ptr;
        }